

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall HighsSymmetryDetection::partitionRefinement(HighsSymmetryDetection *this)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  bool bVar2;
  HighsInt HVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  reference pvVar7;
  reference pvVar8;
  difference_type dVar9;
  reference piVar10;
  ValueType *pVVar11;
  anon_class_8_1_8991fb9c in_RDI;
  HighsInt c_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  u64 hash;
  HighsInt vertex;
  u64 lastHash;
  HighsInt i;
  bool prune;
  HighsInt c;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  HighsInt refineStart;
  HighsInt cellEnd;
  HighsInt firstCellStart;
  HighsInt cellStart;
  undefined4 in_stack_fffffffffffffee8;
  HighsInt in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar12;
  HighsHashTable<int,_unsigned_int> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff18;
  HighsSymmetryDetection *in_stack_ffffffffffffff28;
  HighsInt in_stack_ffffffffffffff30;
  value_type in_stack_ffffffffffffff34;
  HighsSymmetryDetection *in_stack_ffffffffffffff38;
  HighsSymmetryDetection *this_00;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  undefined8 in_stack_ffffffffffffff60;
  anon_class_8_1_8991fb9c aVar13;
  int local_28;
  
  do {
    do {
      do {
        bVar2 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)in_RDI.this);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          HighsHashTable<int,_unsigned_int>::clear
                    ((HighsHashTable<int,_unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          return true;
        }
        iVar5 = std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        iVar6 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        std::
        pop_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
                  (iVar5._M_current,iVar6._M_current);
        pvVar7 = std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        iVar1 = *pvVar7;
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x6c76e8);
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&(in_RDI.this)->cellInRefinementQueue,(long)iVar1);
        *pvVar8 = '\0';
        HVar3 = cellSize((HighsSymmetryDetection *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffeec);
      } while (HVar3 == 1);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(in_RDI.this)->currentPartitionLinks,(long)iVar1);
      iVar12 = *pvVar7;
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      aVar13.this._4_4_ = in_stack_ffffffffffffff0c;
      aVar13.this._0_4_ = in_stack_ffffffffffffff08;
      std::
      partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__0>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,aVar13);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      dVar9 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      iVar4 = (int)dVar9;
    } while (iVar4 == iVar12);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffef8,
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffef8,
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    end._M_current._4_4_ = in_stack_ffffffffffffff0c;
    end._M_current._0_4_ = in_stack_ffffffffffffff08;
    aVar13.this = in_RDI.this;
    pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__1>
              (in_stack_ffffffffffffff10,end,in_RDI);
    local_28 = iVar1;
    if (iVar4 != iVar1) {
      bVar2 = splitCell(aVar13.this,(HighsInt)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (HighsInt)in_stack_ffffffffffffff60);
      if (!bVar2) {
        local_a8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
              bVar2) {
          piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_a8);
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&(in_RDI.this)->cellInRefinementQueue,(long)*piVar10);
          *pvVar8 = '\0';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_a8);
        }
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6c7973)
        ;
        HighsHashTable<int,_unsigned_int>::clear
                  ((HighsHashTable<int,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        return false;
      }
      updateCellMembership
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                 SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      local_28 = iVar4;
    }
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 & 0xffffff;
    in_stack_fffffffffffffef8 = &(in_RDI.this)->vertexHash;
    std::vector<int,_std::allocator<int>_>::operator[]
              (&(in_RDI.this)->currentPartition,(long)local_28);
    pVVar11 = HighsHashTable<int,_unsigned_int>::operator[]
                        ((HighsHashTable<int,_unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         (KeyType_conflict *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff38 = (HighsSymmetryDetection *)(ulong)*pVVar11;
    while (in_stack_ffffffffffffff44 = local_28 + 1, in_stack_ffffffffffffff44 < iVar12) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(in_RDI.this)->currentPartition,(long)in_stack_ffffffffffffff44);
      in_stack_ffffffffffffff34 = *pvVar7;
      pVVar11 = HighsHashTable<int,_unsigned_int>::operator[]
                          ((HighsHashTable<int,_unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           (KeyType_conflict *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      in_stack_ffffffffffffff28 = (HighsSymmetryDetection *)(ulong)*pVVar11;
      this_00 = in_stack_ffffffffffffff38;
      if ((in_stack_ffffffffffffff28 != in_stack_ffffffffffffff38) &&
         (bVar2 = splitCell(aVar13.this,(HighsInt)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (HighsInt)in_stack_ffffffffffffff60),
         this_00 = in_stack_ffffffffffffff28, !bVar2)) {
        in_stack_ffffffffffffff48 = CONCAT13(1,(int3)in_stack_ffffffffffffff48);
        break;
      }
      updateCellMembership
                (this_00,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                 SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      in_stack_ffffffffffffff38 = this_00;
      local_28 = in_stack_ffffffffffffff44;
    }
    if ((in_stack_ffffffffffffff48 & 0x1000000) != 0) {
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
            bVar2) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &stack0xffffffffffffff18);
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&(in_RDI.this)->cellInRefinementQueue,(long)*piVar10);
        *pvVar8 = '\0';
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xffffffffffffff18);
      }
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6c7b4d);
      HighsHashTable<int,_unsigned_int>::clear
                ((HighsHashTable<int,_unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(in_RDI.this)->currentPartitionLinks,(long)iVar1);
      *pvVar7 = iVar12;
      while (in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + -1,
            iVar4 <= in_stack_ffffffffffffff44) {
        updateCellMembership
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      }
      return false;
    }
  } while( true );
}

Assistant:

bool HighsSymmetryDetection::partitionRefinement() {
  while (!refinementQueue.empty()) {
    std::pop_heap(refinementQueue.begin(), refinementQueue.end(),
                  std::greater<HighsInt>());

    HighsInt cellStart = refinementQueue.back();
    HighsInt firstCellStart = cellStart;
    refinementQueue.pop_back();
    cellInRefinementQueue[cellStart] = false;

    if (cellSize(cellStart) == 1) continue;
    HighsInt cellEnd = currentPartitionLinks[cellStart];
    assert(cellEnd >= cellStart);

    // first check which vertices do have updated hash values and put them to
    // the end of the partition
    HighsInt refineStart =
        std::partition(
            currentPartition.begin() + cellStart,
            currentPartition.begin() + cellEnd,
            [&](HighsInt v) { return vertexHash.find(v) == nullptr; }) -
        currentPartition.begin();

    // if there are none there is nothing to refine
    if (refineStart == cellEnd) continue;

    // sort the vertices that have updated hash values by their hash values
    pdqsort(currentPartition.begin() + refineStart,
            currentPartition.begin() + cellEnd, [&](HighsInt v1, HighsInt v2) {
              return vertexHash[v1] < vertexHash[v2];
            });

    // if not all vertices have updated hash values directly create the first
    // new cell at the start of the range that we want to refine
    if (refineStart != cellStart) {
      assert(refineStart != cellStart);
      assert(refineStart != cellEnd);
      if (!splitCell(cellStart, refineStart)) {
        // node can be pruned, make sure hash values are cleared and queue is
        // empty
        for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
        refinementQueue.clear();
        vertexHash.clear();
        return false;
      }
      cellStart = refineStart;
      updateCellMembership(cellStart, cellStart);
    }

    // now update the remaining vertices
    bool prune = false;
    HighsInt i;
    assert(vertexHash.find(currentPartition[cellStart]) != nullptr);
    // store value of first hash
    u64 lastHash = vertexHash[currentPartition[cellStart]];
    for (i = cellStart + 1; i < cellEnd; ++i) {
      HighsInt vertex = currentPartition[i];
      // get this vertex hash value
      u64 hash = vertexHash[vertex];

      if (hash != lastHash) {
        // hash values do not match -> start of new cell
        if (!splitCell(cellStart, i)) {
          // refinement process yielded bad prefix of certificate
          // -> node can be pruned
          prune = true;
          break;
        }
        cellStart = i;
        // remember hash value of this new cell under lastHash
        lastHash = hash;
      }

      // update membership of vertex to new cell
      updateCellMembership(i, cellStart);
    }

    if (prune) {
      // node can be pruned, make sure hash values are cleared and queue is
      // empty
      for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
      refinementQueue.clear();
      vertexHash.clear();
      currentPartitionLinks[firstCellStart] = cellEnd;

      // undo possibly incomplete changes done to the cells
      for (--i; i >= refineStart; --i)
        updateCellMembership(i, firstCellStart, false);

      return false;
    }

    assert(currentPartitionLinks[cellStart] == cellEnd);
  }

  vertexHash.clear();

  return true;
}